

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NotEqualExpression.cpp
# Opt level: O2

NotEqualExpression * __thiscall
ninx::parser::element::NotEqualExpression::clone_impl(NotEqualExpression *this)

{
  NotEqualExpression *this_00;
  __uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_20;
  _Head_base<0UL,_ninx::parser::element::Expression_*,_false> local_18;
  
  this_00 = (NotEqualExpression *)operator_new(0x28);
  ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&local_18);
  ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&local_20);
  NotEqualExpression(this_00,(unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                              *)&local_18,
                     (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                      *)&local_20);
  if ((_Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
       )local_20._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
        .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl !=
      (Expression *)0x0) {
    (**(code **)(*(_func_int **)
                  local_20._M_t.
                  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
                  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl +
                8))();
  }
  local_20._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
       (tuple<ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
        )(_Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
          )0x0;
  if ((Block *)local_18._M_head_impl != (Block *)0x0) {
    (*((ASTElement *)&((local_18._M_head_impl)->super_Statement).super_ASTElement._vptr_ASTElement)
      ->_vptr_ASTElement[1])();
  }
  return this_00;
}

Assistant:

ninx::parser::element::NotEqualExpression *ninx::parser::element::NotEqualExpression::clone_impl() {
    return new NotEqualExpression(this->first->clone<Expression>(), this->second->clone<Expression>());
}